

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManSortUnatesInt
               (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
               Vec_Int_t *vUnateLitsW,Vec_Wec_t *vSorter)

{
  bool bVar1;
  undefined1 auVar2 [16];
  Vec_Int_t *pVVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  
  uVar8 = nWords * 0x40;
  iVar7 = vSorter->nCap;
  if (iVar7 < (int)uVar8) {
    if (vSorter->pArray == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc((long)(int)uVar8 << 4);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(vSorter->pArray,(long)(int)uVar8 << 4);
      iVar7 = vSorter->nCap;
    }
    vSorter->pArray = pVVar3;
    memset(pVVar3 + iVar7,0,(long)(int)(uVar8 - iVar7) << 4);
    vSorter->nCap = uVar8;
  }
  vSorter->nSize = uVar8;
  if (0 < vUnateLits->nSize) {
    lVar6 = 0;
    do {
      uVar8 = vUnateLits->pArray[lVar6];
      if ((int)uVar8 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (vDivs->nSize <= (int)(uVar8 >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((uVar8 & 1) == 0) {
        if (nWords < 1) {
LAB_0079e956:
          uVar10 = 0;
        }
        else {
          uVar4 = 0;
          uVar10 = 0;
          do {
            uVar5 = *(ulong *)((long)vDivs->pArray[uVar8 >> 1] + uVar4 * 8) & pOn[uVar4];
            uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
            uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
            uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
            uVar5 = (uVar5 >> 8) + uVar5;
            lVar9 = (uVar5 >> 0x10) + uVar5;
            uVar10 = uVar10 + ((int)((ulong)lVar9 >> 0x20) + (int)lVar9 & 0xffU);
            uVar4 = uVar4 + 1;
          } while ((uint)nWords != uVar4);
        }
      }
      else {
        if (nWords < 1) goto LAB_0079e956;
        uVar4 = 0;
        uVar10 = 0;
        do {
          uVar5 = ~*(ulong *)((long)vDivs->pArray[uVar8 >> 1] + uVar4 * 8) & pOn[uVar4];
          uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
          uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
          uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
          uVar5 = (uVar5 >> 8) + uVar5;
          lVar9 = (uVar5 >> 0x10) + uVar5;
          uVar10 = uVar10 + ((int)((ulong)lVar9 >> 0x20) + (int)lVar9 & 0xffU);
          uVar4 = uVar4 + 1;
        } while ((uint)nWords != uVar4);
      }
      iVar7 = vSorter->nSize;
      if (iVar7 <= (int)uVar10) {
        iVar12 = uVar10 + 1;
        iVar16 = iVar7 * 2;
        if (iVar7 * 2 <= iVar12) {
          iVar16 = iVar12;
        }
        iVar7 = vSorter->nCap;
        if (iVar7 < iVar16) {
          if (vSorter->pArray == (Vec_Int_t *)0x0) {
            pVVar3 = (Vec_Int_t *)malloc((long)iVar16 << 4);
          }
          else {
            pVVar3 = (Vec_Int_t *)realloc(vSorter->pArray,(long)iVar16 << 4);
            iVar7 = vSorter->nCap;
          }
          vSorter->pArray = pVVar3;
          memset(pVVar3 + iVar7,0,(long)(iVar16 - iVar7) << 4);
          vSorter->nCap = iVar16;
        }
        vSorter->nSize = iVar12;
        iVar7 = iVar12;
      }
      if (((int)uVar10 < 0) || (iVar7 <= (int)uVar10)) goto LAB_0079ebe8;
      Vec_IntPush(vSorter->pArray + uVar10,uVar8);
      lVar6 = lVar6 + 1;
    } while (lVar6 < vUnateLits->nSize);
    uVar8 = vSorter->nSize;
  }
  vUnateLits->nSize = 0;
  vUnateLitsW->nSize = 0;
  if (0 < (int)uVar8) {
    uVar4 = (ulong)uVar8;
    do {
      if ((long)vSorter->nSize < (long)uVar4) {
LAB_0079ebe8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar5 = uVar4 - 1;
      pVVar3 = vSorter->pArray;
      if (0 < pVVar3[uVar5].nSize) {
        lVar6 = 0;
        do {
          Vec_IntPush(vUnateLits,pVVar3[uVar5].pArray[lVar6]);
          Vec_IntPush(vUnateLitsW,(int)uVar5);
          lVar6 = lVar6 + 1;
        } while (lVar6 < pVVar3[uVar5].nSize);
      }
      auVar2 = _DAT_0093d220;
      bVar1 = 1 < (long)uVar4;
      uVar4 = uVar5;
    } while (bVar1);
    iVar7 = vSorter->nSize;
    if (0 < (long)iVar7) {
      pVVar3 = vSorter->pArray;
      lVar6 = (long)iVar7 + -1;
      auVar11._8_4_ = (int)lVar6;
      auVar11._0_8_ = lVar6;
      auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar11 = auVar11 ^ _DAT_0093d220;
      auVar13 = _DAT_0093e4e0;
      auVar14 = _DAT_0093d210;
      do {
        auVar15 = auVar14 ^ auVar2;
        iVar12 = auVar11._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                    iVar12 < auVar15._4_4_) & 1)) {
          *(undefined4 *)((long)&pVVar3->nSize + lVar6) = 0;
        }
        if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
            auVar15._12_4_ <= auVar11._12_4_) {
          *(undefined4 *)((long)&pVVar3[1].nSize + lVar6) = 0;
        }
        auVar15 = auVar13 ^ auVar2;
        iVar16 = auVar15._4_4_;
        if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
          *(undefined4 *)((long)&pVVar3[2].nSize + lVar6) = 0;
          *(undefined4 *)((long)&pVVar3[3].nSize + lVar6) = 0;
        }
        lVar9 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar9 + 4;
        lVar9 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar9 + 4;
        lVar6 = lVar6 + 0x40;
      } while ((ulong)(iVar7 + 3U >> 2) << 6 != lVar6);
    }
  }
  vSorter->nSize = 0;
  return;
}

Assistant:

void Gia_ManSortUnatesInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnateLitsW, Vec_Wec_t * vSorter )
{
    int i, k, iLit;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnateLits, iLit, i )
    {
        word * pDiv = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iLit));
        //assert( !Abc_TtIntersectOne( pOff, 0, pDiv, Abc_LitIsCompl(iLit), nWords ) );
        Vec_WecPush( vSorter, Abc_TtCountOnesVecMask(pDiv, pOn, nWords, Abc_LitIsCompl(iLit)), iLit );
    }
    Vec_IntClear( vUnateLits );
    Vec_IntClear( vUnateLitsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iLit, i )
        {
            Vec_IntPush( vUnateLits, iLit );
            Vec_IntPush( vUnateLitsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );
}